

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

Extension * __thiscall
google::protobuf::internal::ExtensionSet::FindOrNull(ExtensionSet *this,int key)

{
  ushort uVar1;
  int iVar2;
  KeyValue *pKVar3;
  bool bVar4;
  Extension *pEVar5;
  reference ppVar6;
  long lVar7;
  iterator iVar8;
  int iStack_24;
  btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
  bStack_20;
  
  uVar1 = this->flat_size_;
  if (uVar1 != 0) {
    if ((short)uVar1 < 0) {
      iStack_24 = key;
      if ((short)this->flat_size_ < 0) {
        iVar8 = absl::lts_20250127::container_internal::
                btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                ::find<int>((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                             *)(this->map_).flat,&iStack_24);
        bStack_20.node_ =
             (btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              *)iVar8.node_;
        bStack_20.position_ = iVar8.position_;
        iVar8 = absl::lts_20250127::container_internal::
                btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                       *)(this->map_).flat);
        bVar4 = absl::lts_20250127::container_internal::
                btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                ::Equals(&bStack_20,(const_iterator)iVar8);
        if (bVar4) {
          pEVar5 = (Extension *)0x0;
        }
        else {
          ppVar6 = absl::lts_20250127::container_internal::
                   btree_iterator<const_absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_&,_const_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_*>
                   ::operator*(&bStack_20);
          pEVar5 = &ppVar6->second;
        }
        return pEVar5;
      }
      __assert_fail("is_large()",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/extension_set.cc"
                    ,0x6b5,
                    "const ExtensionSet::Extension *google::protobuf::internal::ExtensionSet::FindOrNullInLargeMap(int) const"
                   );
    }
    pKVar3 = (this->map_).flat;
    lVar7 = (ulong)uVar1 << 5;
    do {
      pEVar5 = &pKVar3->second;
      iVar2 = *(int *)((long)(pEVar5 + -1) + 0x10);
      if (iVar2 != key && key <= iVar2) {
        return (Extension *)0x0;
      }
      if (iVar2 == key) {
        return pEVar5;
      }
      pKVar3 = (KeyValue *)(pEVar5 + 1);
      lVar7 = lVar7 + -0x20;
    } while (lVar7 != 0);
  }
  return (Extension *)0x0;
}

Assistant:

const ExtensionSet::Extension* ExtensionSet::FindOrNull(int key) const {
  if (flat_size_ == 0) {
    return nullptr;
  } else if (ABSL_PREDICT_TRUE(!is_large())) {
    for (auto it = flat_begin(), end = flat_end();
         it != end && it->first <= key; ++it) {
      if (it->first == key) return &it->second;
    }
    return nullptr;
  } else {
    return FindOrNullInLargeMap(key);
  }
}